

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O1

Quat<float> __thiscall
Imath_2_5::slerp<float>(Imath_2_5 *this,Quat<float> *q1,Quat<float> *q2,float t)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar11;
  float fVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar13;
  float fVar14;
  Quat<float> QVar15;
  float local_48;
  float fStack_44;
  float fStack_40;
  
  fVar5 = angle4D<float>(q1,q2);
  fVar6 = (1.0 - t) * fVar5;
  fVar7 = 1.0;
  if (1.1920929e-07 <= fVar6 * fVar6) {
    fVar7 = sinf(fVar6);
    fVar7 = fVar7 / fVar6;
  }
  fVar6 = 1.0;
  if (1.1920929e-07 <= fVar5 * fVar5) {
    fVar6 = sinf(fVar5);
    fVar6 = fVar6 / fVar5;
  }
  fVar13 = (1.0 - t) * (fVar7 / fVar6);
  uVar2 = q1->r;
  uVar3 = (q1->v).x;
  uVar4 = (q1->v).y;
  fVar6 = (q1->v).z;
  fVar8 = fVar5 * t;
  fVar14 = 1.0;
  fVar7 = q1->r;
  fVar11 = (q1->v).x;
  fVar12 = (q1->v).y;
  if (1.1920929e-07 <= fVar8 * fVar8) {
    fVar14 = sinf(fVar8);
    fVar14 = fVar14 / fVar8;
    fVar7 = (float)uVar2;
    fVar11 = (float)uVar3;
    fVar12 = (float)uVar4;
  }
  fVar8 = 1.0;
  if (1.1920929e-07 <= fVar5 * fVar5) {
    fVar8 = sinf(fVar5);
    fVar8 = fVar8 / fVar5;
  }
  fVar5 = (fVar14 / fVar8) * t;
  auVar9._0_4_ = fVar7 * fVar13 + fVar5 * q2->r;
  auVar9._4_4_ = fVar11 * fVar13 + fVar5 * (q2->v).x;
  auVar9._8_4_ = fVar12 * fVar13 + fVar5 * (q2->v).y;
  auVar9._12_4_ = fVar6 * fVar13 + fVar5 * (q2->v).z;
  fVar5 = auVar9._0_4_ * auVar9._0_4_ +
          auVar9._12_4_ * auVar9._12_4_ + auVar9._4_4_ * auVar9._4_4_ + auVar9._8_4_ * auVar9._8_4_;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  auVar1._4_4_ = fVar5;
  auVar1._0_4_ = fVar5;
  auVar1._8_4_ = fVar5;
  auVar1._12_4_ = fVar5;
  auVar10 = divps(auVar9,auVar1);
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    auVar10._0_12_ = ZEXT812(0x3f800000);
    auVar10._12_4_ = 0;
  }
  *(undefined1 (*) [16])this = auVar10;
  QVar15.v.x = fVar5;
  QVar15.r = fVar5;
  QVar15.v.y = 0.0;
  QVar15.v.z = 0.0;
  return QVar15;
}

Assistant:

Quat<T>
slerp (const Quat<T> &q1, const Quat<T> &q2, T t)
{
    //
    // Spherical linear interpolation.
    // Assumes q1 and q2 are normalized and that q1 != -q2.
    //
    // This method does *not* interpolate along the shortest
    // arc between q1 and q2.  If you desire interpolation
    // along the shortest arc, and q1^q2 is negative, then
    // consider calling slerpShortestArc(), below, or flipping
    // the second quaternion explicitly.
    //
    // The implementation of squad() depends on a slerp()
    // that interpolates as is, without the automatic
    // flipping.
    //
    // Don Hatch explains the method we use here on his
    // web page, The Right Way to Calculate Stuff, at
    // http://www.plunk.org/~hatch/rightway.php
    //

    T a = angle4D (q1, q2);
    T s = 1 - t;

    Quat<T> q = sinx_over_x (s * a) / sinx_over_x (a) * s * q1 +
	        sinx_over_x (t * a) / sinx_over_x (a) * t * q2;

    return q.normalized();
}